

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O0

double EDCircles::ComputeEllipseError(EllipseEquation *eq,double *px,double *py,int noPoints)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double d2_3;
  double d1_3;
  double y2_3;
  double y1_3;
  double det_3;
  double c_3;
  double b_3;
  double a_3;
  double d2_2;
  double d1_2;
  double y2_2;
  double y1_2;
  double det_2;
  double c_2;
  double b_2;
  double a_2;
  double x;
  double delta;
  double d2_1;
  double d1_1;
  double x2_1;
  double x1_1;
  double y2_1;
  double y1_1;
  double det_1;
  double c_1;
  double b_1;
  double a_1;
  double n_1;
  double m_1;
  double d2;
  double d1;
  double y2;
  double y1;
  double x2;
  double x1;
  double det;
  double c;
  double b;
  double a;
  double n;
  double m;
  double ys;
  double xs;
  double min;
  double dy;
  double dx;
  int i;
  double minor;
  double major;
  double yc;
  double xc;
  double F;
  double E;
  double D;
  double C;
  double B;
  double A;
  double error;
  double *pdStack_20;
  int noPoints_local;
  double *py_local;
  double *px_local;
  EllipseEquation *eq_local;
  
  A = 0.0;
  error._4_4_ = noPoints;
  pdStack_20 = py;
  py_local = px;
  px_local = eq->coeff;
  B = EllipseEquation::A(eq);
  C = EllipseEquation::B((EllipseEquation *)px_local);
  D = EllipseEquation::C((EllipseEquation *)px_local);
  E = EllipseEquation::D((EllipseEquation *)px_local);
  F = EllipseEquation::E((EllipseEquation *)px_local);
  xc = EllipseEquation::F((EllipseEquation *)px_local);
  ComputeEllipseCenterAndAxisLengths
            ((EllipseEquation *)px_local,&yc,&major,&minor,(double *)&stack0xffffffffffffff80);
  for (dx._4_4_ = 0; dx._4_4_ < error._4_4_; dx._4_4_ = dx._4_4_ + 1) {
    dVar1 = py_local[dx._4_4_] - yc;
    dVar2 = pdStack_20[dx._4_4_] - major;
    if (ABS(dVar1) <= ABS(dVar2)) {
      dVar1 = dVar1 / dVar2;
      dVar2 = -dVar1 * major + yc;
      dVar3 = B * dVar1 * dVar1 + C * dVar1 + D;
      dVar4 = E * dVar1 + B * 2.0 * dVar1 * dVar2 + C * dVar2 + F;
      y1_1 = dVar4 * dVar4 + -(dVar3 * 4.0 * (B * dVar2 * dVar2 + E * dVar2 + xc));
      if (y1_1 < 0.0) {
        y1_1 = 0.0;
      }
      dVar5 = sqrt(y1_1);
      dVar6 = -(dVar4 + dVar5) / (dVar3 * 2.0);
      dVar5 = sqrt(y1_1);
      dVar4 = -(dVar4 - dVar5) / (dVar3 * 2.0);
      dVar3 = dVar1 * dVar6 + dVar2;
      ys = dVar1 * dVar4 + dVar2;
      dVar2 = py_local[dx._4_4_] - dVar3;
      dVar6 = pdStack_20[dx._4_4_] - dVar6;
      dVar2 = dVar2 * dVar2 + dVar6 * dVar6;
      dVar1 = py_local[dx._4_4_] - ys;
      dVar4 = pdStack_20[dx._4_4_] - dVar4;
      xs = dVar1 * dVar1 + dVar4 * dVar4;
      if (dVar2 < xs) {
        ys = dVar3;
        xs = dVar2;
      }
    }
    else {
      dVar2 = dVar2 / dVar1;
      dVar1 = -dVar2 * yc + major;
      dVar3 = D * dVar2 * dVar2 + C * dVar2 + B;
      dVar4 = F * dVar2 + C * dVar1 + D * 2.0 * dVar2 * dVar1 + E;
      x1 = dVar4 * dVar4 + -(dVar3 * 4.0 * (D * dVar1 * dVar1 + F * dVar1 + xc));
      if (x1 < 0.0) {
        x1 = 0.0;
      }
      dVar5 = sqrt(x1);
      dVar5 = -(dVar4 + dVar5) / (dVar3 * 2.0);
      dVar6 = sqrt(x1);
      ys = -(dVar4 - dVar6) / (dVar3 * 2.0);
      dVar3 = pdStack_20[dx._4_4_] - (dVar2 * dVar5 + dVar1);
      dVar3 = (py_local[dx._4_4_] - dVar5) * (py_local[dx._4_4_] - dVar5) + dVar3 * dVar3;
      dVar2 = pdStack_20[dx._4_4_] - (dVar2 * ys + dVar1);
      xs = (py_local[dx._4_4_] - ys) * (py_local[dx._4_4_] - ys) + dVar2 * dVar2;
      if (dVar3 < xs) {
        ys = dVar5;
        xs = dVar3;
      }
    }
    a_2 = ys;
    dVar2 = xs;
    do {
      xs = dVar2;
      dVar1 = D;
      a_2 = a_2 + 0.5;
      dVar3 = C * a_2 + F;
      y1_2 = dVar3 * dVar3 + -(D * 4.0 * (B * a_2 * a_2 + E * a_2 + xc));
      if (y1_2 < 0.0) {
        y1_2 = 0.0;
      }
      dVar2 = sqrt(y1_2);
      dVar4 = sqrt(y1_2);
      dVar5 = py_local[dx._4_4_] - a_2;
      dVar2 = pdStack_20[dx._4_4_] - -(dVar3 + dVar2) / (dVar1 * 2.0);
      dVar2 = dVar5 * dVar5 + dVar2 * dVar2;
      dVar1 = pdStack_20[dx._4_4_] - -(dVar3 - dVar4) / (dVar1 * 2.0);
      dVar1 = dVar5 * dVar5 + dVar1 * dVar1;
    } while ((dVar2 <= xs) || (dVar2 = dVar1, dVar1 <= xs));
    a_2 = ys;
    dVar2 = xs;
    do {
      xs = dVar2;
      dVar1 = D;
      a_2 = a_2 - 0.5;
      dVar3 = C * a_2 + F;
      y1_3 = dVar3 * dVar3 + -(D * 4.0 * (B * a_2 * a_2 + E * a_2 + xc));
      if (y1_3 < 0.0) {
        y1_3 = 0.0;
      }
      dVar2 = sqrt(y1_3);
      dVar4 = sqrt(y1_3);
      dVar5 = py_local[dx._4_4_] - a_2;
      dVar2 = pdStack_20[dx._4_4_] - -(dVar3 + dVar2) / (dVar1 * 2.0);
      dVar2 = dVar5 * dVar5 + dVar2 * dVar2;
      dVar1 = pdStack_20[dx._4_4_] - -(dVar3 - dVar4) / (dVar1 * 2.0);
      dVar1 = dVar5 * dVar5 + dVar1 * dVar1;
    } while ((dVar2 <= xs) || (dVar2 = dVar1, dVar1 <= xs));
    A = xs + A;
  }
  dVar2 = sqrt(A / (double)error._4_4_);
  return dVar2;
}

Assistant:

double EDCircles::ComputeEllipseError(EllipseEquation * eq, double * px, double * py, int noPoints)
{
	double error = 0;

	double A = eq->A();
	double B = eq->B();
	double C = eq->C();
	double D = eq->D();
	double E = eq->E();
	double F = eq->F();

	double xc, yc, major, minor;
	ComputeEllipseCenterAndAxisLengths(eq, &xc, &yc, &major, &minor);

	for (int i = 0; i<noPoints; i++) {
		double dx = px[i] - xc;
		double dy = py[i] - yc;

		double min;
		double xs, ys;

		if (fabs(dx) > fabs(dy)) {
			// The line equation is of the form: y = mx+n
			double m = dy / dx;
			double n = yc - m*xc;

			// a*x^2 + b*x + c
			double a = A + B*m + C*m*m;
			double b = B*n + 2 * C*m*n + D + E*m;
			double c = C*n*n + E*n + F;
			double det = b*b - 4 * a*c;
			if (det<0) det = 0;
			double x1 = -(b + sqrt(det)) / (2 * a);
			double x2 = -(b - sqrt(det)) / (2 * a);

			double y1 = m*x1 + n;
			double y2 = m*x2 + n;

			dx = px[i] - x1;
			dy = py[i] - y1;
			double d1 = dx*dx + dy*dy;

			dx = px[i] - x2;
			dy = py[i] - y2;
			double d2 = dx*dx + dy*dy;

			if (d1<d2) { min = d1; xs = x1; ys = y1; }
			else { min = d2; xs = x2; ys = y2; }

		}
		else {
			// The line equation is of the form: x = my+n
			double m = dx / dy;
			double n = xc - m*yc;

			// a*y^2 + b*y + c
			double a = A*m*m + B*m + C;
			double b = 2 * A*m*n + B*n + D*m + E;
			double c = A*n*n + D*n + F;
			double det = b*b - 4 * a*c;
			if (det<0) det = 0;
			double y1 = -(b + sqrt(det)) / (2 * a);
			double y2 = -(b - sqrt(det)) / (2 * a);

			double x1 = m*y1 + n;
			double x2 = m*y2 + n;

			dx = px[i] - x1;
			dy = py[i] - y1;
			double d1 = dx*dx + dy*dy;

			dx = px[i] - x2;
			dy = py[i] - y2;
			double d2 = dx*dx + dy*dy;

			if (d1<d2) { min = d1; xs = x1; ys = y1; }
			else { min = d2; xs = x2; ys = y2; }
		} //end-else

		  // Refine the search in the vicinity of (xs, ys)
		double delta = 0.5;
		double x = xs;
		while (1) {
			x += delta;

			double a = C;
			double b = B*x + E;
			double c = A*x*x + D*x + F;
			double det = b*b - 4 * a*c;
			if (det < 0) det = 0;

			double y1 = -(b + sqrt(det)) / (2 * a);
			double y2 = -(b - sqrt(det)) / (2 * a);

			dx = px[i] - x;
			dy = py[i] - y1;
			double d1 = dx*dx + dy*dy;

			dy = py[i] - y2;
			double d2 = dx*dx + dy*dy;

			if (d1 <= min) { min = d1; }
			else if (d2 <= min) { min = d2; }
			else break;
		} //end-while

		x = xs;
		while (1) {
			x -= delta;

			double a = C;
			double b = B*x + E;
			double c = A*x*x + D*x + F;
			double det = b*b - 4 * a*c;
			if (det < 0) det = 0;

			double y1 = -(b + sqrt(det)) / (2 * a);
			double y2 = -(b - sqrt(det)) / (2 * a);

			dx = px[i] - x;
			dy = py[i] - y1;
			double d1 = dx*dx + dy*dy;

			dy = py[i] - y2;
			double d2 = dx*dx + dy*dy;

			if (d1 <= min) { min = d1; }
			else if (d2 <= min) { min = d2; }
			else break;
		} //end-while

		error += min;
	} //end-for

	error = sqrt(error / noPoints);

	return error;
}